

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

_Bool ssh1_common_filter_queue(PacketProtocolLayer *ppl)

{
  int iVar1;
  PktInQueue *pPVar2;
  LogContext *ctx;
  Ssh *ssh;
  uint uVar3;
  PktIn *pPVar4;
  char *event;
  ptrlen pVar5;
  
  pPVar2 = ppl->in_pq;
  pPVar4 = (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,false);
  do {
    if (pPVar4 == (PktIn *)0x0) {
      return false;
    }
    iVar1 = pPVar4->type;
    if (iVar1 != 0x20) {
      if (iVar1 != 0x24) {
        if (iVar1 == 1) {
          pVar5 = BinarySource_get_string(pPVar4->binarysource_);
          ssh = ppl->ssh;
          uVar3 = string_length_for_printf(pVar5.len);
          ssh_remote_error(ssh,"Remote side sent disconnect message:\n\"%.*s\"",(ulong)uVar3,
                           pVar5.ptr);
          return true;
        }
        return false;
      }
      pVar5 = BinarySource_get_string(pPVar4->binarysource_);
      ctx = ppl->logctx;
      uVar3 = string_length_for_printf(pVar5.len);
      event = dupprintf("Remote debug message: %.*s",(ulong)uVar3,pVar5.ptr);
      logevent_and_free(ctx,event);
    }
    pPVar2 = ppl->in_pq;
    (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,true);
    pPVar2 = ppl->in_pq;
    pPVar4 = (*pPVar2->after)(&pPVar2->pqb,(PacketQueueNode *)pPVar2,false);
  } while( true );
}

Assistant:

bool ssh1_common_filter_queue(PacketProtocolLayer *ppl)
{
    PktIn *pktin;
    ptrlen msg;

    while ((pktin = pq_peek(ppl->in_pq)) != NULL) {
        switch (pktin->type) {
          case SSH1_MSG_DISCONNECT:
            msg = get_string(pktin);
            ssh_remote_error(ppl->ssh,
                             "Remote side sent disconnect message:\n\"%.*s\"",
                             PTRLEN_PRINTF(msg));
            /* don't try to pop the queue, because we've been freed! */
            return true;               /* indicate that we've been freed */

          case SSH1_MSG_DEBUG:
            msg = get_string(pktin);
            ppl_logevent("Remote debug message: %.*s", PTRLEN_PRINTF(msg));
            pq_pop(ppl->in_pq);
            break;

          case SSH1_MSG_IGNORE:
            /* Do nothing, because we're ignoring it! Duhh. */
            pq_pop(ppl->in_pq);
            break;

          default:
            return false;
        }
    }

    return false;
}